

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bean_ptr_impl.hpp
# Opt level: O2

void __thiscall hiberlite::real_bean<Person>::destroy(real_bean<Person> *this)

{
  Person *this_00;
  bean_key bStack_28;
  
  if (this->forgotten == false) {
    bean_key::bean_key(&bStack_28,&this->key);
    Database::dbDelete<Person>(&bStack_28,this->obj);
    shared_res<hiberlite::autoclosed_con>::~shared_res(&bStack_28.con);
    this_00 = this->obj;
    if (this_00 != (Person *)0x0) {
      Person::~Person(this_00);
    }
    operator_delete(this_00);
    this->forgotten = true;
    this->obj = (Person *)0x0;
    (this->key).id = -1;
  }
  return;
}

Assistant:

void real_bean<C>::destroy() {
	if(forgotten)
		return;
	Database::dbDelete(key, *obj);
	delete obj;
	forgotten=true;
	obj=NULL;
	key.id=Database::NULL_ID;
}